

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_00179200;
  std::__cxx11::string::~string((string *)&this->runInfo);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;